

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O2

void __thiscall de::anon_unknown_0::TestThread::run(TestThread *this)

{
  SpinBarrier *pSVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  int iVar4;
  bool bVar5;
  Random rnd;
  deRandom local_40;
  
  dVar2 = deInt32Hash(this->m_numThreads);
  dVar3 = deInt32Hash(this->m_threadNdx);
  deRandom_init(&local_40,dVar2 ^ dVar3);
  iVar4 = 10000;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    LOCK();
    *this->m_sharedVar = *this->m_sharedVar + 1;
    UNLOCK();
    pSVar1 = this->m_barrier;
    getWaitMode(this,(Random *)&local_40);
    SpinBarrier::sync(pSVar1);
    if (*this->m_sharedVar != this->m_numThreads) {
      deAssertFail("*m_sharedVar == m_numThreads",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                   ,0xc5);
    }
    pSVar1 = this->m_barrier;
    getWaitMode(this,(Random *)&local_40);
    SpinBarrier::sync(pSVar1);
    LOCK();
    *this->m_sharedVar = *this->m_sharedVar + -1;
    UNLOCK();
    pSVar1 = this->m_barrier;
    getWaitMode(this,(Random *)&local_40);
    SpinBarrier::sync(pSVar1);
    if (*this->m_sharedVar != 0) {
      deAssertFail("*m_sharedVar == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                   ,0xcf);
    }
    pSVar1 = this->m_barrier;
    getWaitMode(this,(Random *)&local_40);
    SpinBarrier::sync(pSVar1);
  }
  return;
}

Assistant:

void run (void)
	{
		const int	numIters	= 10000;
		de::Random	rnd			(deInt32Hash(m_numThreads) ^ deInt32Hash(m_threadNdx));

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Phase 1: count up
			deAtomicIncrement32(m_sharedVar);

			// Verify
			m_barrier.sync(getWaitMode(rnd));

			DE_TEST_ASSERT(*m_sharedVar == m_numThreads);

			m_barrier.sync(getWaitMode(rnd));

			// Phase 2: count down
			deAtomicDecrement32(m_sharedVar);

			// Verify
			m_barrier.sync(getWaitMode(rnd));

			DE_TEST_ASSERT(*m_sharedVar == 0);

			m_barrier.sync(getWaitMode(rnd));
		}
	}